

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O1

int main(void)

{
  construction_algorithm_parameters();
  space_type_deduction();
  build_kd_tree_with_data_reference();
  build_kd_tree_with_data_move();
  build_kd_tree_with_data_copy();
  return 0;
}

Assistant:

int main() {
  construction_algorithm_parameters();
  space_type_deduction();
  build_kd_tree_with_data_reference();
  build_kd_tree_with_data_move();
  build_kd_tree_with_data_copy();
  return 0;
}